

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

int __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::CanFit
          (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *A,
          IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *B)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  bool bVar4;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  byte local_fd;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  int local_30;
  int local_2c;
  int j;
  int i;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *B_local;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *A_local;
  BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  _j = B;
  B_local = A;
  A_local = (IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IndexNode(&local_90,A);
  iVar1 = IsLeaf(this,&local_90);
  local_fd = 0;
  bVar4 = false;
  if (iVar1 != 0) {
    IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    IndexNode(&local_f0,B);
    local_fd = 1;
    iVar1 = IsLeaf(this,&local_f0);
    bVar4 = iVar1 != 0;
  }
  if ((local_fd & 1) != 0) {
    IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~IndexNode(&local_f0);
  }
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~IndexNode(&local_90);
  if (bVar4) {
    local_2c = 0;
    while( true ) {
      bVar4 = false;
      if (local_2c < this->N + -1) {
        pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&A->v,(long)local_2c);
        bVar4 = *pvVar2 == '1';
      }
      if (!bVar4) break;
      local_2c = local_2c + 1;
    }
    local_30 = 0;
    while( true ) {
      bVar4 = false;
      if (local_30 < this->N + -1) {
        pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&B->v,(long)local_30);
        bVar4 = *pvVar2 == '1';
      }
      if (!bVar4) break;
      local_30 = local_30 + 1;
    }
    this_local._4_4_ = (uint)(local_2c + local_30 <= this->N + -1);
  }
  else {
    IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    IndexNode(&local_160,A);
    iVar1 = IsLeaf(this,&local_160);
    bVar4 = false;
    if (iVar1 == 0) {
      IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      IndexNode(&local_1c0,B);
      iVar1 = IsLeaf(this,&local_1c0);
      bVar4 = iVar1 == 0;
      IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~IndexNode(&local_1c0);
    }
    IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~IndexNode(&local_160);
    if (bVar4) {
      local_2c = 0;
      while( true ) {
        bVar4 = false;
        if (local_2c < this->N) {
          pvVar3 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&A->p,(long)local_2c);
          bVar4 = pvVar3->FileOff != -1;
        }
        if (!bVar4) break;
        local_2c = local_2c + 1;
      }
      local_30 = 0;
      while( true ) {
        bVar4 = false;
        if (local_30 < this->N) {
          pvVar3 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&B->p,(long)local_30);
          bVar4 = pvVar3->FileOff != -1;
        }
        if (!bVar4) break;
        local_30 = local_30 + 1;
      }
      this_local._4_4_ = (uint)(local_2c + local_30 <= this->N);
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int BpTree<K>::CanFit(IndexNode<K> A, IndexNode<K> B) {
	int i, j;
	if (this->IsLeaf(A) && this->IsLeaf(B)){
		for (i = 0; i < N - 1 && A.v[i] == '1'; i++);
		for (j = 0; j < N - 1 && B.v[j] == '1'; j++);
		return i + j <= N - 1;
	}
	else if (!this->IsLeaf(A) && !this->IsLeaf(B)) {
		for (i = 0; i < N && A.p[i].FileOff != -1; i++);
		for (j = 0; j < N && B.p[j].FileOff != -1; j++);
		return i + j <= N;
	}
	else
		return 0;
}